

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_mat * rf_mat_frustum(rf_mat *__return_storage_ptr__,double left,double right,double bottom,
                       double top,double near_val,double far_val)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 auVar4 [16];
  float fVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 in_XMM9_Db;
  undefined1 auVar3 [16];
  
  uVar6 = (uint)((ulong)near_val >> 0x20);
  fVar5 = (float)near_val;
  auVar7._0_4_ = fVar5 + fVar5;
  __return_storage_ptr__->m0 = auVar7._0_4_ / (float)(right - left);
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m8 = ((float)left + (float)right) / (float)(right - left);
  auVar7._4_4_ = (float)bottom + (float)top;
  auVar7._8_4_ = uVar6;
  auVar7._12_4_ = 0;
  auVar1._4_4_ = (float)(top - bottom);
  auVar1._0_4_ = (float)(top - bottom);
  auVar1._8_4_ = in_XMM9_Db;
  auVar1._12_4_ = in_XMM9_Db;
  auVar8 = divps(auVar7,auVar1);
  fVar2 = fVar5 + (float)far_val;
  auVar4._0_8_ = CONCAT44(uVar6,fVar2) ^ 0x8000000080000000;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = (float)(int)auVar8._0_8_;
  __return_storage_ptr__->m9 = (float)(int)((ulong)auVar8._0_8_ >> 0x20);
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  auVar4._8_4_ = uVar6 ^ 0x80000000;
  auVar4._12_4_ = uVar6;
  auVar3._8_8_ = auVar4._8_8_;
  auVar3._0_8_ = CONCAT44(fVar5 * (float)far_val * -2.0,fVar2) ^ 0x80000000;
  auVar8._4_4_ = (float)(far_val - near_val);
  auVar8._0_4_ = (float)(far_val - near_val);
  auVar8._8_8_ = 0;
  auVar8 = divps(auVar3,auVar8);
  __return_storage_ptr__->m10 = (float)(int)auVar8._0_8_;
  __return_storage_ptr__->m14 = (float)(int)((ulong)auVar8._0_8_ >> 0x20);
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = -1.0;
  __return_storage_ptr__->m15 = 0.0;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mat rf_mat_frustum(double left, double right, double bottom, double top, double near_val, double far_val)
{
    rf_mat result = {0};

    float rl = (float) (right - left);
    float tb = (float) (top - bottom);
    float fn = (float) (far_val - near_val);

    result.m0 = ((float) near_val * 2.0f) / rl;
    result.m1 = 0.0f;
    result.m2 = 0.0f;
    result.m3 = 0.0f;

    result.m4 = 0.0f;
    result.m5 = ((float) near_val * 2.0f) / tb;
    result.m6 = 0.0f;
    result.m7 = 0.0f;

    result.m8 = ((float) right + (float) left) / rl;
    result.m9 = ((float) top + (float) bottom) / tb;
    result.m10 = -((float) far_val + (float) near_val) / fn;
    result.m11 = -1.0f;

    result.m12 = 0.0f;
    result.m13 = 0.0f;
    result.m14 = -((float) far_val * (float) near_val * 2.0f) / fn;
    result.m15 = 0.0f;

    return result;
}